

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

void __thiscall
FastLinearExpert<1,_1>::FastLinearExpert
          (FastLinearExpert<1,_1> *this,Z *z,X *x,IMLE<1,_1,_FastLinearExpert> *_mixture)

{
  Param *pPVar1;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_00;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> in_RCX;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *other;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_RDI;
  ReturnType RVar2;
  Scalar SVar3;
  Scalar SVar4;
  double dVar5;
  Scal DEN;
  Scal DOT;
  Z SZ;
  Z Sigma0;
  Matrix<double,_1,_1,_0,_1,_1> *in_stack_fffffffffffffde8;
  LinearExpert<1,_1> *in_stack_fffffffffffffdf0;
  Index in_stack_fffffffffffffdf8;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>_>
  *this_01;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffe08;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffe10;
  Scalar *in_stack_fffffffffffffe18;
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffe20;
  StorageBaseType *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffe38;
  
  LinearExpert<1,_1>::LinearExpert(in_stack_fffffffffffffdf0);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x25c5ca);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x25c5db);
  *(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x188) = in_RCX.m_storage.m_data.array[0];
  pPVar1 = IMLE<1,_1,_FastLinearExpert>::getParameters
                     ((IMLE<1,_1,_FastLinearExpert> *)
                      *(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x188));
  *(Scal *)(in_RDI + 0x78) = pPVar1->alpha;
  pPVar1 = IMLE<1,_1,_FastLinearExpert>::getParameters
                     ((IMLE<1,_1,_FastLinearExpert> *)
                      *(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x188));
  *(Scal *)(in_RDI + 0x80) = pPVar1->wPsi;
  pPVar1 = IMLE<1,_1,_FastLinearExpert>::getParameters
                     ((IMLE<1,_1,_FastLinearExpert> *)
                      *(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x188));
  *(Scal *)(in_RDI + 0x88) = pPVar1->wNu;
  pPVar1 = IMLE<1,_1,_FastLinearExpert>::getParameters
                     ((IMLE<1,_1,_FastLinearExpert> *)
                      *(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x188));
  *(double *)(in_RDI + 0x90) =
       pPVar1->wSigma + 1.0 +
       (double)(~-(ulong)((double)*(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x88) == 0.0) &
                0x4000000000000000 |
               (ulong)((uint)(-(ulong)((double)*(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x88)
                                      == 0.0) >> 0x20) & 0x3ff00000) << 0x20);
  pPVar1 = IMLE<1,_1,_FastLinearExpert>::getParameters
                     ((IMLE<1,_1,_FastLinearExpert> *)
                      *(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x188));
  *(Scal *)(in_RDI + 0x98) = pPVar1->wLambda;
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::operator=
            (&in_stack_fffffffffffffdf0->Nu,in_stack_fffffffffffffde8);
  *(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x38) =
       (DenseStorage<double,_1,_1,_1,_0>)0x3eb0c6f7a0b5ed8d;
  *(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x40) = (DenseStorage<double,_1,_1,_1,_0>)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI,
             in_stack_fffffffffffffdf8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI,
             in_stack_fffffffffffffdf8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI,
             in_stack_fffffffffffffdf8,(Index)in_stack_fffffffffffffdf0);
  other = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *)(in_RDI + 0x80);
  IMLE<1,_1,_FastLinearExpert>::getPsi
            ((IMLE<1,_1,_FastLinearExpert> *)*(DenseStorage<double,_1,_1,_1,_0> *)(in_RDI + 0x188));
  Eigen::operator*((double *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  Eigen::Matrix<double,1,1,0,1,1>::operator=(&in_stack_fffffffffffffdf0->Nu,other);
  this_00 = in_RDI + 0x98;
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::setIdentity
            (in_RDI,in_stack_fffffffffffffdf8,(Index)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::operator/=
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  pPVar1 = IMLE<1,_1,_FastLinearExpert>::getParameters
                     (*(IMLE<1,_1,_FastLinearExpert> **)(in_RDI + 0x188));
  this_01 = (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>_>
             *)&pPVar1->wSigma;
  IMLE<1,_1,_FastLinearExpert>::getSigma(*(IMLE<1,_1,_FastLinearExpert> **)(in_RDI + 0x188));
  Eigen::operator*((double *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  Eigen::Matrix<double,1,1,0,1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>>
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::cwiseInverse(in_stack_fffffffffffffe08);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::asDiagonal((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                *)this_01);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,
             (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            (this_00,(MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)other);
  Eigen::Matrix<double,1,1,0,1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Matrix<double,1,1,0,1,1>,0>>
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
              *)other);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::dot<Eigen::Matrix<double,1,1,0,1,1>>
                    (this_00,(MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_fffffffffffffe38,(double *)in_stack_fffffffffffffe30);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)other);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
               *)in_stack_fffffffffffffe08,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-=
            (in_stack_fffffffffffffe10,
             (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
              *)in_stack_fffffffffffffe08);
  SVar3 = Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::prod
                    ((DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_00);
  *(double *)
   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI + 0x1a0) =
       1.0 / SVar3;
  *(double *)
   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI + 0x1a0) =
       *(double *)
        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI + 0x1a0) /
       (RVar2 * *(double *)
                 ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI +
                 0x88) + 1.0);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,(Matrix<double,_1,_1,_0,_1,_1> *)other);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,(Matrix<double,_1,_1,_0,_1,_1> *)other);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI,(Index)this_01,
             (Index)this_00);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_fffffffffffffe38,(double *)in_stack_fffffffffffffe30);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
  ::cwiseInverse((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                  *)in_stack_fffffffffffffe08);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>_>
  ::asDiagonal(this_01);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,
             (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>_>_>
              *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_fffffffffffffe38,(double *)in_stack_fffffffffffffe30);
  SVar4 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
          ::prod((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                  *)this_00);
  dVar5 = sqrt(1.0 / SVar4);
  *(double *)
   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI + 0x148) = dVar5;
  IMLE<1,_1,_FastLinearExpert>::getPsi
            (*(IMLE<1,_1,_FastLinearExpert> **)
              ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI +
              0x188));
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_fffffffffffffe38,(double *)in_stack_fffffffffffffe30);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::cwiseInverse(in_stack_fffffffffffffe08);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)other);
  SVar3 = Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::prod
                    ((DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_00);
  dVar5 = sqrt(SVar3);
  *(double *)
   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI + 0x150) = dVar5;
  ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI)[0xa0] =
       (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>)0x1;
  return;
}

Assistant:

FAST_LINEAR_EXPERT_base::FastLinearExpert(Z const &z, X const &x, IMLE<d,D,::FastLinearExpert> *_mixture)
#endif
{
    mixture = _mixture;

    alpha = mixture->getParameters().alpha;
    wPsi = mixture->getParameters().wPsi;
    wNu = mixture->getParameters().wNu;
    wSigma = mixture->getParameters().wSigma + d + ((wNu==0) ? 1.0 : 2.0);
    wLambda = mixture->getParameters().wLambda;

    Nu0 = z;


    H = EPSILON;

    Sh = 0.0;
    Sz.setZero(d);
    Sx.setZero(D);
    Sxz.setZero(D,d);
    Sxx = wPsi * mixture->getPsi();
//Sxx = X::Zero(D);
    invSzz.setIdentity(d,d) /= wLambda;
    Z Sigma0 = mixture->getParameters().wSigma*mixture->getSigma();
    invSzz0 = Sigma0.cwiseInverse().asDiagonal();
	// Using Moore-Penrose Rank-1 update
	Z SZ = invSzz0 * Nu0;
	Scal DOT = Nu0.dot(SZ);
	Scal DEN = DOT + 1 / wNu;
	invSzz0 -= (SZ/DEN) * SZ.transpose();

	// Using Determinant Rank-1 update
	detInvSzz0 = 1.0 / Sigma0.prod();
	detInvSzz0 /= (DOT*wNu + 1.0);

    Nu = z;
    Mu = x;
    Lambda.setZero(D,d);
    invSigma = (Sigma0/wSigma).cwiseInverse().asDiagonal();
    sqrtDetInvSigma = sqrt( 1.0 / (Sigma0/wSigma).prod() );

    Psi = mixture->getPsi() / (1.0 + 2.0/wPsi) ;
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

//    invSzz.setIdentity(d,d) /= EPSILON;
//    invSzz0.setIdentity(d,d) /= this->w0 * this->sigma;
//    detInvSzz0 = 1.0 / pow(this->w0 * this->sigma, d);
//
//    this->Nu = z;
//    this->Mu = x;
//    this->Lambda.setZero(D,d);
//    this->invSSEzz.setZero(d,d);
//
//    this->invSigma.setIdentity(d,d) *=  (this->w0+d+1.0)/(this->w0*this->sigma);
//    this->sqrtDetInvSigma = pow((this->w0+d+1.0)/(this->w0*this->sigma), d/2.0);
//
//    this->recompute = true;
    recompute = true;
}